

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDIS.cpp
# Opt level: O0

KBOOL __thiscall
ExampleSubscriber::OnDataReceived
          (ExampleSubscriber *this,KOCTET *Data,KUINT32 DataLength,KString *SenderIp)

{
  ostream *poVar1;
  KString *SenderIp_local;
  KUINT32 DataLength_local;
  KOCTET *Data_local;
  ExampleSubscriber *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Received ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,DataLength);
  poVar1 = std::operator<<(poVar1," bytes from ");
  poVar1 = std::operator<<(poVar1,(string *)SenderIp);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return true;
}

Assistant:

virtual KBOOL OnDataReceived( const KOCTET * Data, KUINT32 DataLength, const KString & SenderIp )
    {
        cout << "Received " << DataLength << " bytes from " << SenderIp << endl;

        // We return true here, if we return false then the data will be discarded by the connection class.
        // This means an IP address based filter could be implemented here.
        return true;
    }